

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O1

int ON_String::Length(char *s,size_t string_capacity)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar2 = 0;
  if (s != (char *)0x0) {
    sVar3 = 0x7ffffffd;
    if (string_capacity < 0x7ffffffd) {
      sVar3 = string_capacity;
    }
    if (string_capacity != 0) {
      sVar1 = 0;
      do {
        sVar2 = sVar1;
        if (s[sVar1] == '\0') break;
        sVar1 = sVar1 + 1;
        sVar2 = sVar3;
      } while (sVar3 != sVar1);
    }
  }
  return (int)sVar2;
}

Assistant:

int ON_String::Length(
  const char* s,
  size_t string_capacity
)
{
  if (nullptr == s)
    return 0;
  if (string_capacity > 2147483645)
    string_capacity = 2147483645;
  size_t slen = 0;
  while (slen < string_capacity && 0 != *s++)
    slen++;
  return ((int)slen);
}